

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZDICT_count(void *pIn,void *pMatch)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0;
  while( true ) {
    if (*(ulong *)((long)pMatch + lVar2) != *(ulong *)((long)pIn + lVar2)) break;
    lVar2 = lVar2 + 8;
  }
  uVar3 = *(ulong *)((long)pIn + lVar2) ^ *(ulong *)((long)pMatch + lVar2);
  uVar1 = 0;
  if (uVar3 != 0) {
    for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  return (uVar1 >> 3 & 0x1fffffff) + lVar2;
}

Assistant:

static size_t ZDICT_count(const void* pIn, const void* pMatch)
{
    const char* const pStart = (const char*)pIn;
    for (;;) {
        size_t const diff = MEM_readST(pMatch) ^ MEM_readST(pIn);
        if (!diff) {
            pIn = (const char*)pIn+sizeof(size_t);
            pMatch = (const char*)pMatch+sizeof(size_t);
            continue;
        }
        pIn = (const char*)pIn+ZSTD_NbCommonBytes(diff);
        return (size_t)((const char*)pIn - pStart);
    }
}